

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall
QPDFArgParser::Members::Members(Members *this,int argc,char **argv,char *progname_env)

{
  pointer argv0;
  char *pcVar1;
  allocator<char> local_69;
  string local_68;
  unique_ptr<char[],_std::default_delete<char[]>_> local_48;
  unique_ptr<char[],_std::default_delete<char[]>_> tmp;
  allocator<char> local_29;
  char *local_28;
  char *progname_env_local;
  char **argv_local;
  Members *pMStack_10;
  int argc_local;
  Members *this_local;
  
  this->argc = argc;
  this->argv = argv;
  local_28 = progname_env;
  progname_env_local = (char *)argv;
  argv_local._4_4_ = argc;
  pMStack_10 = this;
  std::__cxx11::string::string((string *)&this->whoami);
  pcVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->progname_env,pcVar1,&local_29)
  ;
  std::allocator<char>::~allocator(&local_29);
  this->cur_arg = 0;
  this->bash_completion = false;
  this->zsh_completion = false;
  std::__cxx11::string::string((string *)&this->bash_prev);
  std::__cxx11::string::string((string *)&this->bash_cur);
  std::__cxx11::string::string((string *)&this->bash_line);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->completions);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>_>_>_>
  ::map(&this->option_tables);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
  ::map(&this->main_option_table);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
  ::map(&this->help_option_table);
  this->option_table = (option_table_t *)0x0;
  std::__cxx11::string::string((string *)&this->option_table_name);
  std::function<void_()>::function(&this->final_check_handler,(nullptr_t)0x0);
  std::vector<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>::vector
            (&this->new_argv);
  std::vector<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>::vector
            (&this->bash_argv);
  std::shared_ptr<const_char_*>::shared_ptr(&this->argv_ph);
  std::shared_ptr<const_char_*>::shared_ptr(&this->bash_argv_ph);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
  ::map(&this->help_topics);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
  ::map(&this->option_help);
  std::__cxx11::string::string((string *)&this->help_footer);
  pcVar1 = *(char **)progname_env_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar1,&local_69);
  QUtil::make_unique_cstr((QUtil *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  argv0 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_48);
  pcVar1 = QUtil::getWhoami(argv0);
  std::__cxx11::string::operator=((string *)&this->whoami,pcVar1);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_48);
  return;
}

Assistant:

QPDFArgParser::Members::Members(int argc, char const* const argv[], char const* progname_env) :

    argc(argc),
    argv(argv),
    progname_env(progname_env),
    cur_arg(0),
    bash_completion(false),
    zsh_completion(false),
    option_table(nullptr),
    final_check_handler(nullptr)
{
    auto tmp = QUtil::make_unique_cstr(argv[0]);
    whoami = QUtil::getWhoami(tmp.get());
}